

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O2

cbtVector3 __thiscall
cbt2DarcShape::localGetSupportingVertexWithoutMargin(cbt2DarcShape *this,cbtVector3 *vec0)

{
  float fVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [16];
  cbtVector3 cVar4;
  cbtVector3 D;
  cbtVector3 local_20;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)&(this->super_cbtConvexInternalShape).field_0x44;
  auVar3 = vsubps_avx(ZEXT816(0) << 0x40,auVar3);
  local_20.m_floats._0_8_ = auVar3._0_8_;
  local_20.m_floats[2] = 0.0;
  local_20.m_floats[3] = 0.0;
  cbtVector3::normalize(&local_20);
  fVar1 = this->radius;
  cVar4.m_floats[0] = fVar1 * local_20.m_floats[0];
  cVar4.m_floats[1] = fVar1 * local_20.m_floats[1];
  auVar2._4_8_ = SUB128(ZEXT812(0),4);
  auVar2._0_4_ = fVar1 * local_20.m_floats[2];
  cVar4.m_floats._8_8_ = auVar2._0_8_;
  return (cbtVector3)cVar4.m_floats;
}

Assistant:

cbtVector3	cbt2DarcShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0)const
{
	cbtVector3 supVec(0,0,0);
	
    cbtVector3 O1(x,y,0);
	
    cbtVector3 D( supVec-O1 );
    D.normalize();

    supVec = D * radius;

	return supVec;
}